

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

Vec3fa __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::BSplineCurveT>
::computeDirection(CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::BSplineCurveT>
                   *this,uint primID)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  uint uVar6;
  long *plVar7;
  long lVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ulong in_RDX;
  undefined4 in_register_00000034;
  Vec3fa *axis1;
  Vec3fa VVar18;
  
  plVar7 = *(long **)(CONCAT44(in_register_00000034,primID) + 0x188);
  uVar6 = *(uint *)(*(long *)(CONCAT44(in_register_00000034,primID) + 0x58) +
                   (in_RDX & 0xffffffff) * *(long *)(CONCAT44(in_register_00000034,primID) + 0x68));
  lVar8 = *plVar7;
  lVar9 = plVar7[2];
  pfVar1 = (float *)(lVar8 + (ulong)uVar6 * lVar9);
  fVar10 = pfVar1[2];
  fVar11 = pfVar1[3];
  pfVar2 = (float *)(lVar8 + (ulong)(uVar6 + 1) * lVar9);
  fVar12 = pfVar2[2];
  fVar13 = pfVar2[3];
  pfVar3 = (float *)(lVar8 + (ulong)(uVar6 + 2) * lVar9);
  fVar14 = pfVar3[2];
  fVar15 = pfVar3[3];
  pfVar4 = (float *)(lVar8 + (ulong)(uVar6 + 3) * lVar9);
  fVar16 = pfVar4[2];
  fVar17 = pfVar4[3];
  fVar5 = *(float *)(CONCAT44(in_register_00000034,primID) + 0x24c);
  VVar18.field_0._0_4_ = *pfVar1 * 0.16666667 + *pfVar2 * 0.6666667 + *pfVar3 * 0.16666667;
  VVar18.field_0._4_4_ = pfVar1[1] * 0.16666667 + pfVar2[1] * 0.6666667 + pfVar3[1] * 0.16666667;
  VVar18.field_0._8_4_ =
       (*pfVar2 * 0.16666667 + *pfVar3 * 0.6666667 + *pfVar4 * 0.16666667) - VVar18.field_0._0_4_;
  VVar18.field_0._12_4_ =
       (pfVar2[1] * 0.16666667 + pfVar3[1] * 0.6666667 + pfVar4[1] * 0.16666667) -
       VVar18.field_0._4_4_;
  *(float *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
             super_Geometry.super_RefCount._vptr_RefCount = VVar18.field_0._8_4_;
  *(float *)((long)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                    super_Geometry.super_RefCount._vptr_RefCount + 4) = VVar18.field_0._12_4_;
  *(float *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
             super_Geometry.super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       (fVar12 * 0.16666667 + fVar14 * 0.6666667 + fVar16 * 0.16666667) -
       (fVar10 * 0.16666667 + fVar12 * 0.6666667 + fVar14 * 0.16666667);
  *(float *)((long)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                    super_Geometry.super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i
            + 4) =
       (fVar13 * fVar5 * 0.16666667 + fVar15 * fVar5 * 0.6666667 + fVar17 * fVar5 * 0.16666667) -
       (fVar11 * fVar5 * 0.16666667 + fVar13 * fVar5 * 0.6666667 + fVar15 * fVar5 * 0.16666667);
  return (Vec3fa)VVar18.field_0;
}

Assistant:

Vec3fa computeDirection(unsigned int primID) const
      {
        const Curve3ff c = getCurveScaledRadius(primID);
        const Vec3fa p0 = c.begin();
        const Vec3fa p3 = c.end();
        const Vec3fa axis1 = p3 - p0;
        return axis1;
      }